

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

int __thiscall AbstractModuleClient::processTimer(AbstractModuleClient *this,int timer_id)

{
  void *pvVar1;
  mutex *in_RDI;
  size_t eventsize;
  int event;
  undefined8 local_18;
  undefined1 local_10 [16];
  
  local_18 = 4;
  if (in_RDI[8].super___mutex_base._M_mutex.__data.__list.__prev != (__pthread_internal_list *)0x0)
  {
    std::mutex::lock(in_RDI);
    pvVar1 = zsock_resolve(in_RDI[8].super___mutex_base._M_mutex.__data.__list.__prev);
    zmq_getsockopt(pvVar1,0xf,local_10,&local_18);
    std::mutex::unlock((mutex *)0x1c31f4);
  }
  return 0;
}

Assistant:

int AbstractModuleClient::processTimer(int timer_id){
    int event;
    size_t eventsize = sizeof(event);
    if(timestampsub){
        tsmutex.lock();
        zmq_getsockopt (zsock_resolve(timestampsub), ZMQ_EVENTS, &event, &eventsize);
        tsmutex.unlock();
    }
    return 0;
}